

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::FunctionDefinition::dump_abi_cxx11_
          (string *__return_storage_ptr__,FunctionDefinition *this,int level)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  pointer pFVar4;
  pointer pBVar5;
  allocator local_2a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260 [32];
  string local_240 [32];
  reference local_220;
  unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
  *argument;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *__range1;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [380];
  int local_1c;
  FunctionDefinition *pFStack_18;
  int level_local;
  FunctionDefinition *this_local;
  
  local_1c = level;
  pFStack_18 = this;
  this_local = (FunctionDefinition *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  uVar2 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,uVar2,'\t',&local_1e9);
  std::operator+(&local_1c8,&local_1e8,"FunctionDefinition ");
  poVar3 = std::operator<<(local_198,(string *)&local_1c8);
  poVar3 = std::operator<<(poVar3,(string *)&this->name);
  poVar3 = std::operator<<(poVar3," {");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  __end1 = std::
           vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
           ::begin(&this->arguments);
  argument = (unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
              *)std::
                vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                ::end(&this->arguments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>_>
                                *)&argument);
    if (!bVar1) break;
    local_220 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>_>
                ::operator*(&__end1);
    pFVar4 = std::
             unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
             ::operator->(local_220);
    (*(pFVar4->super_ASTElement)._vptr_ASTElement[3])(local_240,pFVar4,(ulong)(local_1c + 1));
    poVar3 = std::operator<<(local_198,local_240);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_240);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>_>
    ::operator++(&__end1);
  }
  pBVar5 = std::
           unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ::operator->(&this->body);
  (*(pBVar5->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[3])
            (local_260,pBVar5,(ulong)(local_1c + 1));
  poVar3 = std::operator<<(local_198,local_260);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_260);
  uVar2 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,uVar2,'\t',&local_2a1);
  std::operator+(&local_280,&local_2a0,"}");
  poVar3 = std::operator<<(local_198,(string *)&local_280);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::FunctionDefinition::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "FunctionDefinition " << this->name << " {" << std::endl;
    for (auto& argument : arguments) {
        s << argument->dump(level+1) << std::endl;
    }
    s << body->dump(level+1) << std::endl;
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}